

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O0

void __thiscall
axl::sl::StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::release
          (StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_> *this)

{
  StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_> *in_RDI;
  
  if (in_RDI->m_hdr != (BufHdr *)0x0) {
    rc::RefCount::release((RefCount *)in_RDI);
  }
  initialize(in_RDI);
  return;
}

Assistant:

void
	release() {
		if (m_hdr)
			m_hdr->release();

		initialize();
	}